

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tznames.cpp
# Opt level: O1

void __thiscall icu_63::TimeZoneNamesDelegate::~TimeZoneNamesDelegate(TimeZoneNamesDelegate *this)

{
  int32_t *piVar1;
  
  (this->super_TimeZoneNames).super_UObject._vptr_UObject =
       (_func_int **)&PTR__TimeZoneNamesDelegate_003a6f90;
  umtx_lock_63((UMutex *)gTimeZoneNamesLock);
  if (this->fTZnamesCacheEntry != (TimeZoneNamesCacheEntry *)0x0) {
    piVar1 = &this->fTZnamesCacheEntry->refCount;
    *piVar1 = *piVar1 + -1;
  }
  umtx_unlock_63((UMutex *)gTimeZoneNamesLock);
  UObject::~UObject((UObject *)this);
  return;
}

Assistant:

TimeZoneNamesDelegate::~TimeZoneNamesDelegate() {
    umtx_lock(&gTimeZoneNamesLock);
    {
        if (fTZnamesCacheEntry) {
            U_ASSERT(fTZnamesCacheEntry->refCount > 0);
            // Just decrement the reference count
            fTZnamesCacheEntry->refCount--;
        }
    }
    umtx_unlock(&gTimeZoneNamesLock);
}